

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_string.cc
# Opt level: O3

void __thiscall ctemplate::TemplateString::AddToGlobalIdToNameMap(TemplateString *this)

{
  char *__src;
  size_t size;
  int iVar1;
  const_iterator cVar2;
  BaseArena *this_00;
  _Hashtable<ctemplate::TemplateString,_ctemplate::TemplateString,_std::allocator<ctemplate::TemplateString>,_std::__detail::_Identity,_std::equal_to<ctemplate::TemplateString>,_ctemplate::TemplateStringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *__dest;
  ReaderMutexLock reader_lock;
  WriterMutexLock writer_lock;
  __node_gen_type __node_gen;
  ReaderMutexLock local_58;
  WriterMutexLock local_50;
  key_type local_48;
  
  if ((this->id_ & 1) == 0) {
    AddToGlobalIdToNameMap();
  }
  else {
    local_58.mu_ = (Mutex *)(anonymous_namespace)::mutex;
    if (((anonymous_namespace)::mutex[0x38] != '\x01') ||
       (iVar1 = pthread_rwlock_rdlock((pthread_rwlock_t *)(anonymous_namespace)::mutex), iVar1 == 0)
       ) {
      if ((anonymous_namespace)::template_string_set !=
          (_Hashtable<ctemplate::TemplateString,_ctemplate::TemplateString,_std::allocator<ctemplate::TemplateString>,_std::__detail::_Identity,_std::equal_to<ctemplate::TemplateString>,_ctemplate::TemplateStringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)0x0) {
        local_48.ptr_ = this->ptr_;
        local_48.length_ = this->length_;
        local_48.is_immutable_ = this->is_immutable_;
        local_48._17_7_ = *(undefined7 *)&this->field_0x11;
        local_48.id_ = this->id_;
        cVar2 = std::
                _Hashtable<ctemplate::TemplateString,_ctemplate::TemplateString,_std::allocator<ctemplate::TemplateString>,_std::__detail::_Identity,_std::equal_to<ctemplate::TemplateString>,_ctemplate::TemplateStringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find((anonymous_namespace)::template_string_set,&local_48);
        if (cVar2.super__Node_iterator_base<ctemplate::TemplateString,_true>._M_cur !=
            (__node_type *)0x0) {
          ReaderMutexLock::~ReaderMutexLock(&local_58);
          return;
        }
      }
      ReaderMutexLock::~ReaderMutexLock(&local_58);
      local_50.mu_ = (Mutex *)(anonymous_namespace)::mutex;
      if (((anonymous_namespace)::mutex[0x38] != '\x01') ||
         (iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)(anonymous_namespace)::mutex),
         iVar1 == 0)) {
        if ((anonymous_namespace)::template_string_set ==
            (_Hashtable<ctemplate::TemplateString,_ctemplate::TemplateString,_std::allocator<ctemplate::TemplateString>,_std::__detail::_Identity,_std::equal_to<ctemplate::TemplateString>,_ctemplate::TemplateStringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             *)0x0) {
          (anonymous_namespace)::template_string_set =
               (_Hashtable<ctemplate::TemplateString,_ctemplate::TemplateString,_std::allocator<ctemplate::TemplateString>,_std::__detail::_Identity,_std::equal_to<ctemplate::TemplateString>,_ctemplate::TemplateStringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)operator_new(0x40);
          (anonymous_namespace)::template_string_set->_M_buckets =
               &(anonymous_namespace)::template_string_set->_M_single_bucket;
          (anonymous_namespace)::template_string_set->_M_bucket_count = 1;
          ((anonymous_namespace)::template_string_set->_M_before_begin)._M_nxt =
               (_Hash_node_base *)0x0;
          (anonymous_namespace)::template_string_set->_M_element_count = 0;
          ((anonymous_namespace)::template_string_set->_M_rehash_policy)._M_max_load_factor = 1.0;
          ((anonymous_namespace)::template_string_set->_M_rehash_policy)._M_next_resize = 0;
          (anonymous_namespace)::template_string_set->_M_single_bucket = (__node_base_ptr)0x0;
        }
        if ((anonymous_namespace)::arena == (BaseArena *)0x0) {
          this_00 = (BaseArena *)operator_new(0x168);
          BaseArena::BaseArena(this_00,(char *)0x0,0x400,false);
          this_00->_vptr_BaseArena = (_func_int **)&PTR__BaseArena_0014d540;
          (anonymous_namespace)::arena = this_00;
        }
        cVar2 = std::
                _Hashtable<ctemplate::TemplateString,_ctemplate::TemplateString,_std::allocator<ctemplate::TemplateString>,_std::__detail::_Identity,_std::equal_to<ctemplate::TemplateString>,_ctemplate::TemplateStringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find((anonymous_namespace)::template_string_set,this);
        if (cVar2.super__Node_iterator_base<ctemplate::TemplateString,_true>._M_cur ==
            (__node_type *)0x0) {
          if (this->is_immutable_ == true) {
            local_48.ptr_ = (char *)(anonymous_namespace)::template_string_set;
            std::
            _Hashtable<ctemplate::TemplateString,ctemplate::TemplateString,std::allocator<ctemplate::TemplateString>,std::__detail::_Identity,std::equal_to<ctemplate::TemplateString>,ctemplate::TemplateStringHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<ctemplate::TemplateString_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<ctemplate::TemplateString,true>>>>
                      ((_Hashtable<ctemplate::TemplateString,ctemplate::TemplateString,std::allocator<ctemplate::TemplateString>,std::__detail::_Identity,std::equal_to<ctemplate::TemplateString>,ctemplate::TemplateStringHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)(anonymous_namespace)::template_string_set,this);
          }
          else {
            __src = this->ptr_;
            size = this->length_;
            __dest = (_Hashtable<ctemplate::TemplateString,_ctemplate::TemplateString,_std::allocator<ctemplate::TemplateString>,_std::__detail::_Identity,_std::equal_to<ctemplate::TemplateString>,_ctemplate::TemplateStringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)BaseArena::GetMemory((anonymous_namespace)::arena,size,1);
            memcpy(__dest,__src,size);
            local_48.length_ = this->length_;
            local_48.id_ = this->id_;
            local_48.is_immutable_ = true;
            local_58.mu_ = (Mutex *)(anonymous_namespace)::template_string_set;
            local_48.ptr_ = (char *)__dest;
            std::
            _Hashtable<ctemplate::TemplateString,ctemplate::TemplateString,std::allocator<ctemplate::TemplateString>,std::__detail::_Identity,std::equal_to<ctemplate::TemplateString>,ctemplate::TemplateStringHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<ctemplate::TemplateString,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<ctemplate::TemplateString,true>>>>
                      ();
          }
        }
        WriterMutexLock::~WriterMutexLock(&local_50);
        return;
      }
    }
  }
  abort();
}

Assistant:

LOCKS_EXCLUDED(mutex) {
  // shouldn't be calling this if we don't have an id.
  CHECK(IsTemplateIdInitialized(id_));
  {
    // Check to see if it's already here.
    ReaderMutexLock reader_lock(&mutex);
    if (template_string_set) {
      const TemplateString* iter =
          find_ptr0(*template_string_set, *this);
      if (iter) {
        DCHECK_EQ(TemplateString(ptr_, length_),
                  TemplateString(iter->ptr_, iter->length_))
            << "TemplateId collision!";
        return;
      }
    }
  }
  WriterMutexLock writer_lock(&mutex);
  // First initialize our data structures if we need to.
  if (!template_string_set) {
    template_string_set = new TemplateStringSet;
  }

  if (!arena) {
    arena = new UnsafeArena(1024);  // 1024 was picked out of a hat.
  }

  if (template_string_set->count(*this)) {
    return;
  }
  // If we are immutable, we can store ourselves directly in the map.
  // Otherwise, we need to make an immutable copy.
  if (is_immutable()) {
    template_string_set->insert(*this);
  } else {
    const char* immutable_copy = arena->Memdup(ptr_, length_);
    template_string_set->insert(
        TemplateString(immutable_copy, length_, true, id_));
  }
}